

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<capnp::_::BuilderArena::LocalCapTable>::disposeImpl
          (HeapDisposer<capnp::_::BuilderArena::LocalCapTable> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_>::dispose
              ((ArrayBuilder<kj::Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>_> *)
               ((long)pointer + 8));
  }
  operator_delete(pointer,0x28);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }